

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void lodepng_info_cleanup(LodePNGInfo *info)

{
  uchar *__ptr;
  uint i;
  long lVar1;
  
  __ptr = (info->color).palette;
  if (__ptr != (uchar *)0x0) {
    free(__ptr);
  }
  (info->color).palette = (uchar *)0x0;
  (info->color).palettesize = 0;
  LodePNGText_cleanup(info);
  LodePNGIText_cleanup(info);
  lVar1 = 0;
  do {
    free(info->unknown_chunks_data[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void lodepng_info_cleanup(LodePNGInfo* info)
{
	lodepng_color_mode_cleanup(&info->color);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
	LodePNGText_cleanup(info);
	LodePNGIText_cleanup(info);

	LodePNGUnknownChunks_cleanup(info);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
}